

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IrisUtils.cpp
# Opt level: O1

void IRIS::SaveSplit(string *path,Dataset *dataset)

{
  ostream *poVar1;
  pointer pvVar2;
  ulong uVar3;
  ulong uVar4;
  ofstream file;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)path,_S_out);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((dataset->xTrain).
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (dataset->xTrain).
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      pvVar2 = (dataset->xTrain).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl + 8) !=
          *(pointer *)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl) {
        uVar4 = 0;
        do {
          poVar1 = std::ostream::_M_insert<double>
                             ((double)*(float *)(*(long *)&pvVar2[uVar3].
                                                                                                                      
                                                  super__Vector_base<float,_std::allocator<float>_>
                                                + uVar4 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
          uVar4 = uVar4 + 1;
          pvVar2 = (dataset->xTrain).
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar4 < (ulong)((long)*(pointer *)
                                        ((long)&(pvVar2->
                                                super__Vector_base<float,_std::allocator<float>_>).
                                                _M_impl + 8) -
                                 *(long *)&(pvVar2->
                                           super__Vector_base<float,_std::allocator<float>_>).
                                           _M_impl >> 2));
      }
      poVar1 = std::ostream::_M_insert<double>
                         ((double)(dataset->yTrain).
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      uVar3 = uVar3 + 1;
      uVar4 = ((long)(dataset->xTrain).
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(dataset->xTrain).
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar3 <= uVar4 && uVar4 - uVar3 != 0);
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((dataset->xTest).
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (dataset->xTest).
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      pvVar2 = (dataset->xTest).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data + 8) !=
          (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        uVar4 = 0;
        do {
          poVar1 = std::ostream::_M_insert<double>
                             ((double)*(float *)(*(long *)&pvVar2[uVar3].
                                                                                                                      
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl + uVar4 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
          uVar4 = uVar4 + 1;
          pvVar2 = (dataset->xTest).
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar4 < (ulong)((long)*(pointer *)
                                        ((long)&(pvVar2->
                                                super__Vector_base<float,_std::allocator<float>_>).
                                                _M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&(pvVar2->
                                           super__Vector_base<float,_std::allocator<float>_>).
                                           _M_impl.super__Vector_impl_data >> 2));
      }
      poVar1 = std::ostream::_M_insert<double>
                         ((double)(dataset->yTest).super__Vector_base<float,_std::allocator<float>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      uVar3 = uVar3 + 1;
      uVar4 = ((long)(dataset->xTest).
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(dataset->xTest).
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar3 <= uVar4 && uVar4 - uVar3 != 0);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void IRIS::SaveSplit( const std::string &path, SPIKING_NN::Dataset &dataset )
{
    std::ofstream file( path );
    file << dataset.xTrain.size() << "\n";
    for ( int sampleId = 0; sampleId < dataset.xTrain.size(); ++sampleId ) {
        for ( int paramId = 0; paramId < dataset.xTrain[0].size(); ++paramId ) {
            file << dataset.xTrain[sampleId][paramId] << " ";
        }
        file << dataset.yTrain[sampleId] << "\n";
    }
    file << dataset.xTest.size() << "\n";
    for ( int sampleId = 0; sampleId < dataset.xTest.size(); ++sampleId ) {
        for ( int paramId = 0; paramId < dataset.xTest[0].size(); ++paramId ) {
            file << dataset.xTest[sampleId][paramId] << " ";
        }
        file << dataset.yTest[sampleId] << "\n";
    }
}